

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O3

void __thiscall
matrix_sparse_row_test_sparse_accessor_Test::~matrix_sparse_row_test_sparse_accessor_Test
          (matrix_sparse_row_test_sparse_accessor_Test *this)

{
  pointer pdVar1;
  pointer piVar2;
  
  (this->super_matrix_sparse_row_test).super_Test._vptr_Test =
       (_func_int **)&PTR__matrix_sparse_row_test_00161a50;
  pdVar1 = (this->super_matrix_sparse_row_test).csr_data.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->super_matrix_sparse_row_test).csr_data.value.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  piVar2 = (this->super_matrix_sparse_row_test).csr_data.i_column.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_matrix_sparse_row_test).csr_data.i_column.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_matrix_sparse_row_test).csr_data.row_offset.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, sparse_accessor) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);
  const int initial_offset = csr_data.row_offset.back();
  // Read existing element
  EXPECT_DOUBLE_EQ(row[1], 3.0);

  // Death on 'read' like operation of non existing column.
  double force_read;
  EXPECT_DEATH(force_read = row[0], "./*");

  // Modify existing element
  row[3] = 10.0;
  EXPECT_DOUBLE_EQ(row[3], 10.0);

  // Insert new element
  row[2] = 8.0;
  EXPECT_DOUBLE_EQ(row[2], 8.0);

  // Verify row properties after modification
  EXPECT_EQ(row.row_offset(), 6);                             // added one entry
  EXPECT_EQ(row.size_non_zero(), 4);                          // added one entry
  EXPECT_EQ(csr_data.row_offset.back(), initial_offset + 1);  // added one entry

  auto it = row.begin();
  EXPECT_EQ((*it).i_column(), 1);
  EXPECT_DOUBLE_EQ((*it).value(), 3.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 2);
  EXPECT_DOUBLE_EQ((*it).value(), 8.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 3);
  EXPECT_DOUBLE_EQ((*it).value(), 10.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 4);
  EXPECT_DOUBLE_EQ((*it).value(), 5.0);
}